

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O3

Wlc_Ntk_t * Wlc_NtkMemBlast(Wlc_Ntk_t *p)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  Vec_Int_t *vFanins;
  Wlc_Ntk_t *pNew;
  long lVar8;
  Vec_Int_t *pVVar9;
  char *pcVar10;
  long lVar11;
  size_t sVar12;
  
  uVar1 = p->nObjsAlloc;
  if ((p->vCopies).nCap < (int)uVar1) {
    piVar7 = (p->vCopies).pArray;
    if (piVar7 == (int *)0x0) {
      piVar7 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar7 = (int *)realloc(piVar7,(long)(int)uVar1 << 2);
    }
    (p->vCopies).pArray = piVar7;
    if (piVar7 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vCopies).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((p->vCopies).pArray,0,(ulong)uVar1 * 4);
  }
  (p->vCopies).nSize = uVar1;
  vFanins = (Vec_Int_t *)malloc(0x10);
  vFanins->nCap = 100;
  vFanins->nSize = 0;
  piVar7 = (int *)malloc(400);
  vFanins->pArray = piVar7;
  pNew = Wlc_NtkAlloc(p->pName,p->nObjsAlloc);
  iVar2 = p->fAsyncRst;
  iVar5 = p->fMemPorts;
  iVar6 = p->fEasyFfs;
  pNew->fSmtLib = p->fSmtLib;
  pNew->fAsyncRst = iVar2;
  pNew->fMemPorts = iVar5;
  pNew->fEasyFfs = iVar6;
  if (0 < (p->vCis).nSize) {
    lVar11 = 0;
    do {
      iVar2 = (p->vCis).pArray[lVar11];
      if ((iVar2 < 1) || (p->nObjsAlloc <= iVar2)) goto LAB_0035c85c;
      Wlc_ObjDup(pNew,p,iVar2,vFanins);
      lVar11 = lVar11 + 1;
    } while (lVar11 < (p->vCis).nSize);
  }
  if (0 < (p->vCos).nSize) {
    lVar11 = 0;
    do {
      iVar2 = (p->vCos).pArray[lVar11];
      if ((iVar2 < 1) || (p->nObjsAlloc <= iVar2)) goto LAB_0035c85c;
      Wlc_NtkMemBlast_rec(pNew,p,iVar2,vFanins);
      lVar11 = lVar11 + 1;
      iVar2 = (p->vCos).nSize;
    } while (lVar11 < iVar2);
    if (0 < iVar2) {
      lVar11 = 0;
      do {
        iVar2 = (p->vCos).pArray[lVar11];
        lVar8 = (long)iVar2;
        if ((lVar8 < 1) || (p->nObjsAlloc <= iVar2)) {
LAB_0035c85c:
          __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                        ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
        }
        if ((p->vCopies).nSize <= iVar2) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar2 = (p->vCopies).pArray[lVar8];
        if (((long)iVar2 < 1) || (pNew->nObjsAlloc <= iVar2)) goto LAB_0035c85c;
        Wlc_ObjSetCo(pNew,pNew->pObjs + iVar2,*(uint *)(p->pObjs + lVar8) >> 10 & 1);
        lVar11 = lVar11 + 1;
      } while (lVar11 < (p->vCos).nSize);
    }
  }
  pVVar3 = p->vInits;
  if (pVVar3 != (Vec_Int_t *)0x0) {
    pVVar9 = (Vec_Int_t *)malloc(0x10);
    iVar2 = pVVar3->nSize;
    pVVar9->nSize = iVar2;
    pVVar9->nCap = iVar2;
    if ((long)iVar2 == 0) {
      sVar12 = 0;
      piVar7 = (int *)0x0;
    }
    else {
      sVar12 = (long)iVar2 << 2;
      piVar7 = (int *)malloc(sVar12);
    }
    pVVar9->pArray = piVar7;
    memcpy(piVar7,pVVar3->pArray,sVar12);
    pNew->vInits = pVVar9;
  }
  pcVar4 = p->pInits;
  if (pcVar4 != (char *)0x0) {
    sVar12 = strlen(pcVar4);
    pcVar10 = (char *)malloc(sVar12 + 1);
    strcpy(pcVar10,pcVar4);
    pNew->pInits = pcVar10;
  }
  if (vFanins->pArray != (int *)0x0) {
    free(vFanins->pArray);
  }
  free(vFanins);
  pcVar4 = p->pSpec;
  if (pcVar4 != (char *)0x0) {
    sVar12 = strlen(pcVar4);
    pcVar10 = (char *)malloc(sVar12 + 1);
    strcpy(pcVar10,pcVar4);
    pNew->pSpec = pcVar10;
  }
  return pNew;
}

Assistant:

Wlc_Ntk_t * Wlc_NtkMemBlast( Wlc_Ntk_t * p )
{
    Wlc_Ntk_t * pNew;
    Wlc_Obj_t * pObj;
    Vec_Int_t * vFanins;
    int i;
    Wlc_NtkCleanCopy( p );
    vFanins = Vec_IntAlloc( 100 );
    pNew = Wlc_NtkAlloc( p->pName, p->nObjsAlloc );
    pNew->fSmtLib = p->fSmtLib;
    pNew->fAsyncRst = p->fAsyncRst;
    pNew->fMemPorts = p->fMemPorts;
    pNew->fEasyFfs = p->fEasyFfs;
    Wlc_NtkForEachCi( p, pObj, i )
        Wlc_ObjDup( pNew, p, Wlc_ObjId(p, pObj), vFanins );
    Wlc_NtkForEachCo( p, pObj, i )
        Wlc_NtkMemBlast_rec( pNew, p, Wlc_ObjId(p, pObj), vFanins );
    Wlc_NtkForEachCo( p, pObj, i )
        Wlc_ObjSetCo( pNew, Wlc_ObjCopyObj(pNew, p, pObj), pObj->fIsFi );
    if ( p->vInits )
    pNew->vInits = Vec_IntDup( p->vInits );
    if ( p->pInits )
    pNew->pInits = Abc_UtilStrsav( p->pInits );
    Vec_IntFree( vFanins );
    if ( p->pSpec )
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    return pNew;
}